

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O3

void __thiscall
duckdb::PipelineExecutor::EndOperator
          (PipelineExecutor *this,PhysicalOperator *op,optional_ptr<duckdb::DataChunk,_true> chunk)

{
  optional_ptr<duckdb::DataChunk,_true> local_10;
  
  local_10.ptr = chunk.ptr;
  OperatorProfiler::EndOperator(&((this->context).thread)->profiler,chunk);
  if (chunk.ptr != (DataChunk *)0x0) {
    optional_ptr<duckdb::DataChunk,_true>::CheckValid(&local_10);
    DataChunk::Verify(local_10.ptr);
  }
  return;
}

Assistant:

void PipelineExecutor::EndOperator(PhysicalOperator &op, optional_ptr<DataChunk> chunk) {
	context.thread.profiler.EndOperator(chunk);

	if (chunk) {
		chunk->Verify();
	}
}